

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::CloseFileStreams(cmMakefileTargetGenerator *this)

{
  cmMakefileTargetGenerator *this_local;
  
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
            (&this->BuildFileStream,(pointer)0x0);
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
            (&this->InfoFileStream,(pointer)0x0);
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
            (&this->FlagFileStream,(pointer)0x0);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CloseFileStreams()
{
  this->BuildFileStream.reset();
  this->InfoFileStream.reset();
  this->FlagFileStream.reset();
}